

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O2

string * __thiscall
libcellml::XmlDoc::prettyPrint_abi_cxx11_(string *__return_storage_ptr__,XmlDoc *this)

{
  xmlChar *buffer;
  int size;
  stringstream res;
  ostream local_188 [376];
  
  size = 0;
  xmlDocDumpFormatMemoryEnc(this->mPimpl->mXmlDocPtr,&buffer,&size,"UTF-8",1);
  std::__cxx11::stringstream::stringstream((stringstream *)&res);
  std::operator<<(local_188,(char *)buffer);
  (*_xmlFree)(buffer);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlDoc::prettyPrint() const
{
    xmlChar *buffer;
    int size = 0;
    xmlDocDumpFormatMemoryEnc(mPimpl->mXmlDocPtr, &buffer, &size, "UTF-8", 1);
    std::stringstream res;
    res << buffer;
    xmlFree(buffer);
    return res.str();
}